

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void * resizebox(lua_State *L,int idx,size_t newsize)

{
  lua_Alloc p_Var1;
  undefined8 *puVar2;
  void *pvVar3;
  void *temp;
  UBox *box;
  lua_Alloc allocf;
  void *ud;
  size_t newsize_local;
  lua_State *plStack_10;
  int idx_local;
  lua_State *L_local;
  
  ud = (void *)newsize;
  newsize_local._4_4_ = idx;
  plStack_10 = L;
  p_Var1 = lua_getallocf(L,&allocf);
  puVar2 = (undefined8 *)lua_touserdata(plStack_10,newsize_local._4_4_);
  pvVar3 = (*p_Var1)(allocf,(void *)*puVar2,puVar2[1],(size_t)ud);
  if (pvVar3 == (void *)0x0 && ud != (void *)0x0) {
    lua_pushstring(plStack_10,"not enough memory");
    lua_error(plStack_10);
  }
  *puVar2 = pvVar3;
  puVar2[1] = ud;
  return pvVar3;
}

Assistant:

static void *resizebox (lua_State *L, int idx, size_t newsize) {
  void *ud;
  lua_Alloc allocf = lua_getallocf(L, &ud);
  UBox *box = (UBox *)lua_touserdata(L, idx);
  void *temp = allocf(ud, box->box, box->bsize, newsize);
  if (l_unlikely(temp == NULL && newsize > 0)) {  /* allocation error? */
    lua_pushliteral(L, "not enough memory");
    lua_error(L);  /* raise a memory error */
  }
  box->box = temp;
  box->bsize = newsize;
  return temp;
}